

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O0

ai_real distance3D(aiVector3D *vA,aiVector3D *vB)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  ai_real d;
  ai_real a;
  ai_real lz;
  ai_real ly;
  ai_real lx;
  aiVector3D *vB_local;
  aiVector3D *vA_local;
  
  fVar1 = vB->x - vA->x;
  fVar2 = vB->y - vA->y;
  fVar3 = vB->z - vA->z;
  dVar4 = pow((double)(fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2),0.5);
  return (float)dVar4;
}

Assistant:

static ai_real distance3D( const aiVector3D &vA, aiVector3D &vB ) {
    const ai_real lx = ( vB.x - vA.x );
    const ai_real ly = ( vB.y - vA.y );
    const ai_real lz = ( vB.z - vA.z );
    ai_real a = lx*lx + ly*ly + lz*lz;
    ai_real d = pow( a, (ai_real)0.5 );

    return d;
}